

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O2

bool __thiscall
lzham::vector<unsigned_char>::insert(vector<unsigned_char> *this,uint index,uchar *p,uint n)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  
  bVar3 = true;
  if (n != 0) {
    uVar1 = this->m_size;
    bVar2 = try_resize(this,uVar1 + n,true);
    if (bVar2) {
      uVar4 = uVar1 - index;
      if (uVar4 != 0) {
        memmove(this->m_p + index + n,this->m_p + index,(ulong)uVar4);
      }
      memcpy(this->m_p + index,p,(ulong)n);
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

inline bool insert(uint index, const T* p, uint n)
      {
         LZHAM_ASSERT(index <= m_size);
         if (!n)
            return true;
                  
         const uint orig_size = m_size;
         if (!try_resize(m_size + n, true))
            return false;

         const uint num_to_move = orig_size - index;
         if (num_to_move)
         {
            if (LZHAM_IS_BITWISE_COPYABLE(T))
               memmove(m_p + index + n, m_p + index, sizeof(T) * num_to_move);
            else
            {
               const T* pSrc = m_p + orig_size - 1;
               T* pDst = const_cast<T*>(pSrc) + n;

               for (uint i = 0; i < num_to_move; i++)
               {
                  LZHAM_ASSERT((pDst - m_p) < (int)m_size);
                  *pDst-- = *pSrc--;
               }
            }
         }

         T* pDst = m_p + index;

         if (LZHAM_IS_BITWISE_COPYABLE(T))
            memcpy(pDst, p, sizeof(T) * n);
         else
         {
            for (uint i = 0; i < n; i++)
            {
               LZHAM_ASSERT((pDst - m_p) < (int)m_size);
               *pDst++ = *p++;
            }
         }

         return true;
      }